

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  int iVar1;
  xmlNsPtr cur_00;
  xmlChar *pxVar2;
  xmlNs *local_38;
  xmlNsPtr prev;
  xmlNsPtr cur;
  xmlChar *prefix_local;
  xmlChar *href_local;
  xmlNodePtr node_local;
  
  if ((node != (xmlNodePtr)0x0) && (node->type != XML_ELEMENT_NODE)) {
    return (xmlNsPtr)0x0;
  }
  cur_00 = (xmlNsPtr)(*xmlMalloc)(0x30);
  if (cur_00 == (xmlNsPtr)0x0) {
    return (xmlNsPtr)0x0;
  }
  memset(cur_00,0,0x30);
  cur_00->type = XML_NAMESPACE_DECL;
  if (href != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(href);
    cur_00->href = pxVar2;
    if (cur_00->href == (xmlChar *)0x0) goto LAB_00160b3b;
  }
  if (prefix != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(prefix);
    cur_00->prefix = pxVar2;
    if (cur_00->prefix == (xmlChar *)0x0) goto LAB_00160b3b;
  }
  if (node == (xmlNodePtr)0x0) {
    return cur_00;
  }
  if (node->nsDef == (xmlNs *)0x0) {
    node->nsDef = cur_00;
    return cur_00;
  }
  local_38 = node->nsDef;
  iVar1 = xmlStrEqual(local_38->prefix,cur_00->prefix);
  if (iVar1 == 0) goto LAB_00160ae6;
  pxVar2 = local_38->href;
  while (pxVar2 == (xmlChar *)0x0) {
LAB_00160ae6:
    do {
      if (local_38->next == (_xmlNs *)0x0) {
        local_38->next = cur_00;
        return cur_00;
      }
      local_38 = local_38->next;
      iVar1 = xmlStrEqual(local_38->prefix,cur_00->prefix);
    } while (iVar1 == 0);
    pxVar2 = local_38->href;
  }
LAB_00160b3b:
  xmlFreeNs(cur_00);
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL) {
	cur->href = xmlStrdup(href);
        if (cur->href == NULL)
            goto error;
    }
    if (prefix != NULL) {
	cur->prefix = xmlStrdup(prefix);
        if (cur->prefix == NULL)
            goto error;
    }

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                (prev->href != NULL))
                goto error;
	    while (prev->next != NULL) {
	        prev = prev->next;
		if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                    (prev->href != NULL))
                    goto error;
	    }
	    prev->next = cur;
	}
    }
    return(cur);

error:
    xmlFreeNs(cur);
    return(NULL);
}